

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printTotals(ConsoleReporter *this,Totals *totals)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  size_t sVar3;
  pointer pcVar4;
  ostream *poVar5;
  vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_> columns;
  char local_199;
  undefined1 local_198 [8];
  _Alloc_hider local_190;
  undefined1 local_188 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_170;
  SummaryColumn local_158;
  undefined1 local_118 [40];
  undefined1 local_f0 [8];
  _Alloc_hider local_e8;
  undefined1 local_e0 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  sVar2 = (totals->testCases).failed;
  sVar3 = (totals->testCases).failedButOk;
  if ((totals->testCases).passed + sVar2 + sVar3 == 0) {
    poVar5 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
    local_198 = (undefined1  [8])((ulong)(uint7)local_198._1_7_ << 8);
    Colour::use(BrightYellow);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"No tests ran\n",0xd);
    Colour::use(None);
  }
  else if ((sVar3 == 0 && sVar2 == 0) &&
          ((totals->assertions).failed + (totals->assertions).passed !=
           -(totals->assertions).failedButOk)) {
    poVar5 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
    local_198 = (undefined1  [8])((ulong)(uint7)local_198._1_7_ << 8);
    Colour::use(BrightGreen);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"All tests passed",0x10);
    Colour::use(None);
    poVar5 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," (",2);
    pcVar4 = (pointer)(totals->assertions).passed;
    paVar1 = &local_158.label.field_2;
    local_158.label._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"assertion","");
    local_198 = (undefined1  [8])pcVar4;
    local_190._M_p = local_188 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_190,local_158.label._M_dataplus._M_p,
               local_158.label._M_dataplus._M_p + local_158.label._M_string_length);
    operator<<(poVar5,(pluralise *)local_198);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," in ",4);
    pcVar4 = (pointer)(totals->testCases).passed;
    local_118._0_8_ = (pointer)(local_118 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"test case","");
    local_f0 = (undefined1  [8])pcVar4;
    local_e8._M_p = local_e0 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,local_118._0_8_,
               (undefined1 *)
               ((long)&(((string *)local_118._0_8_)->_M_dataplus)._M_p +
               (long)&(((string *)local_118._8_8_)->_M_dataplus)._M_p));
    operator<<(poVar5,(pluralise *)local_f0);
    local_199 = ')';
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_199,1);
    local_199 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_199,1);
    if (local_e8._M_p != local_e0 + 8) {
      operator_delete(local_e8._M_p,local_e0._8_8_ + 1);
    }
    if ((pointer)local_118._0_8_ != (pointer)(local_118 + 0x10)) {
      operator_delete((void *)local_118._0_8_,
                      (ulong)((long)&(((string *)local_118._16_8_)->_M_dataplus)._M_p + 1));
    }
    if (local_190._M_p != local_188 + 8) {
      operator_delete(local_190._M_p,local_188._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158.label._M_dataplus._M_p != paVar1) {
      operator_delete(local_158.label._M_dataplus._M_p,
                      local_158.label.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_118._0_8_ = (pointer)0x0;
    local_118._8_8_ = (pointer)0x0;
    local_118._16_8_ = (pointer)0x0;
    local_50 = &local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
    paVar1 = &local_158.label.field_2;
    if (local_50 == &local_40) {
      local_158.label.field_2._8_8_ = local_40._8_8_;
      local_158.label._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_158.label._M_dataplus._M_p = (pointer)local_50;
    }
    local_158.label.field_2._M_allocated_capacity._1_7_ = local_40._M_allocated_capacity._1_7_;
    local_158.label.field_2._M_local_buf[0] = local_40._M_local_buf[0];
    local_158.label._M_string_length = local_48;
    local_48 = 0;
    local_40._M_local_buf[0] = '\0';
    local_158.colour = None;
    local_158.rows.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_158.rows.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_158.rows.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_50 = &local_40;
    SummaryColumn::addRow
              ((SummaryColumn *)local_f0,&local_158,
               (totals->testCases).failed + (totals->testCases).passed +
               (totals->testCases).failedButOk);
    SummaryColumn::addRow
              ((SummaryColumn *)local_198,(SummaryColumn *)local_f0,
               (totals->assertions).failed + (totals->assertions).passed +
               (totals->assertions).failedButOk);
    clara::std::vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>::
    emplace_back<Catch::SummaryColumn>
              ((vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_> *)local_118,
               (SummaryColumn *)local_198);
    clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_170);
    if (local_198 != (undefined1  [8])local_188) {
      operator_delete((void *)local_198,local_188._0_8_ + 1);
    }
    clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c8);
    if (local_f0 != (undefined1  [8])local_e0) {
      operator_delete((void *)local_f0,local_e0._0_8_ + 1);
    }
    clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_158.rows);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158.label._M_dataplus._M_p != paVar1) {
      operator_delete(local_158.label._M_dataplus._M_p,
                      local_158.label.field_2._M_allocated_capacity + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(local_40._M_allocated_capacity._1_7_,
                                        local_40._M_local_buf[0]) + 1);
    }
    local_70 = &local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"passed","");
    if (local_70 == &local_60) {
      local_158.label.field_2._8_8_ = local_60._8_8_;
      local_158.label._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_158.label._M_dataplus._M_p = (pointer)local_70;
    }
    local_158.label.field_2._M_allocated_capacity._1_7_ = local_60._M_allocated_capacity._1_7_;
    local_158.label.field_2._M_local_buf[0] = local_60._M_local_buf[0];
    local_158.label._M_string_length = local_68;
    local_68 = 0;
    local_60._M_local_buf[0] = '\0';
    local_158.colour = Green;
    local_158.rows.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_158.rows.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_158.rows.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_70 = &local_60;
    SummaryColumn::addRow((SummaryColumn *)local_f0,&local_158,(totals->testCases).passed);
    SummaryColumn::addRow
              ((SummaryColumn *)local_198,(SummaryColumn *)local_f0,(totals->assertions).passed);
    clara::std::vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>::
    emplace_back<Catch::SummaryColumn>
              ((vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_> *)local_118,
               (SummaryColumn *)local_198);
    clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_170);
    if (local_198 != (undefined1  [8])local_188) {
      operator_delete((void *)local_198,local_188._0_8_ + 1);
    }
    clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c8);
    if (local_f0 != (undefined1  [8])local_e0) {
      operator_delete((void *)local_f0,local_e0._0_8_ + 1);
    }
    clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_158.rows);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158.label._M_dataplus._M_p != paVar1) {
      operator_delete(local_158.label._M_dataplus._M_p,
                      local_158.label.field_2._M_allocated_capacity + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,CONCAT71(local_60._M_allocated_capacity._1_7_,
                                        local_60._M_local_buf[0]) + 1);
    }
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"failed","");
    if (local_90 == &local_80) {
      local_158.label.field_2._8_8_ = local_80._8_8_;
      local_158.label._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_158.label._M_dataplus._M_p = (pointer)local_90;
    }
    local_158.label.field_2._M_allocated_capacity._1_7_ = local_80._M_allocated_capacity._1_7_;
    local_158.label.field_2._M_local_buf[0] = local_80._M_local_buf[0];
    local_158.label._M_string_length = local_88;
    local_88 = 0;
    local_80._M_local_buf[0] = '\0';
    local_158.colour = BrightRed;
    local_158.rows.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_158.rows.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_158.rows.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_90 = &local_80;
    SummaryColumn::addRow((SummaryColumn *)local_f0,&local_158,(totals->testCases).failed);
    SummaryColumn::addRow
              ((SummaryColumn *)local_198,(SummaryColumn *)local_f0,(totals->assertions).failed);
    clara::std::vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>::
    emplace_back<Catch::SummaryColumn>
              ((vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_> *)local_118,
               (SummaryColumn *)local_198);
    clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_170);
    if (local_198 != (undefined1  [8])local_188) {
      operator_delete((void *)local_198,local_188._0_8_ + 1);
    }
    clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c8);
    if (local_f0 != (undefined1  [8])local_e0) {
      operator_delete((void *)local_f0,local_e0._0_8_ + 1);
    }
    clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_158.rows);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158.label._M_dataplus._M_p != paVar1) {
      operator_delete(local_158.label._M_dataplus._M_p,
                      local_158.label.field_2._M_allocated_capacity + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,CONCAT71(local_80._M_allocated_capacity._1_7_,
                                        local_80._M_local_buf[0]) + 1);
    }
    local_b0 = &local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"failed as expected","");
    if (local_b0 == &local_a0) {
      local_158.label.field_2._8_8_ = local_a0._8_8_;
      local_158.label._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_158.label._M_dataplus._M_p = (pointer)local_b0;
    }
    local_158.label.field_2._M_allocated_capacity._1_7_ = local_a0._M_allocated_capacity._1_7_;
    local_158.label.field_2._M_local_buf[0] = local_a0._M_local_buf[0];
    local_158.label._M_string_length = local_a8;
    local_a8 = 0;
    local_a0._M_local_buf[0] = '\0';
    local_158.colour = BrightYellow;
    local_158.rows.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_158.rows.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_158.rows.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b0 = &local_a0;
    SummaryColumn::addRow((SummaryColumn *)local_f0,&local_158,(totals->testCases).failedButOk);
    SummaryColumn::addRow
              ((SummaryColumn *)local_198,(SummaryColumn *)local_f0,(totals->assertions).failedButOk
              );
    clara::std::vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>::
    emplace_back<Catch::SummaryColumn>
              ((vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_> *)local_118,
               (SummaryColumn *)local_198);
    clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_170);
    if (local_198 != (undefined1  [8])local_188) {
      operator_delete((void *)local_198,local_188._0_8_ + 1);
    }
    clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c8);
    if (local_f0 != (undefined1  [8])local_e0) {
      operator_delete((void *)local_f0,local_e0._0_8_ + 1);
    }
    clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_158.rows);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158.label._M_dataplus._M_p != paVar1) {
      operator_delete(local_158.label._M_dataplus._M_p,
                      local_158.label.field_2._M_allocated_capacity + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,CONCAT71(local_a0._M_allocated_capacity._1_7_,
                                        local_a0._M_local_buf[0]) + 1);
    }
    local_198 = (undefined1  [8])local_188;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"test cases","");
    printSummaryRow(this,(string *)local_198,
                    (vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_> *)local_118
                    ,0);
    if (local_198 != (undefined1  [8])local_188) {
      operator_delete((void *)local_198,local_188._0_8_ + 1);
    }
    local_198 = (undefined1  [8])local_188;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"assertions","");
    printSummaryRow(this,(string *)local_198,
                    (vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_> *)local_118
                    ,1);
    if (local_198 != (undefined1  [8])local_188) {
      operator_delete((void *)local_198,local_188._0_8_ + 1);
    }
    clara::std::vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>::~vector
              ((vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_> *)local_118);
  }
  return;
}

Assistant:

void ConsoleReporter::printTotals( Totals const& totals ) {
    if (totals.testCases.total() == 0) {
        stream << Colour(Colour::Warning) << "No tests ran\n";
    } else if (totals.assertions.total() > 0 && totals.testCases.allPassed()) {
        stream << Colour(Colour::ResultSuccess) << "All tests passed";
        stream << " ("
            << pluralise(totals.assertions.passed, "assertion") << " in "
            << pluralise(totals.testCases.passed, "test case") << ')'
            << '\n';
    } else {

        std::vector<SummaryColumn> columns;
        columns.push_back(SummaryColumn("", Colour::None)
                          .addRow(totals.testCases.total())
                          .addRow(totals.assertions.total()));
        columns.push_back(SummaryColumn("passed", Colour::Success)
                          .addRow(totals.testCases.passed)
                          .addRow(totals.assertions.passed));
        columns.push_back(SummaryColumn("failed", Colour::ResultError)
                          .addRow(totals.testCases.failed)
                          .addRow(totals.assertions.failed));
        columns.push_back(SummaryColumn("failed as expected", Colour::ResultExpectedFailure)
                          .addRow(totals.testCases.failedButOk)
                          .addRow(totals.assertions.failedButOk));

        printSummaryRow("test cases", columns, 0);
        printSummaryRow("assertions", columns, 1);
    }
}